

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_allocator.cpp
# Opt level: O0

void __thiscall
duckdb::FixedSizeAllocator::Merge(FixedSizeAllocator *this,FixedSizeAllocator *other)

{
  bool bVar1;
  long in_RSI;
  FixedSizeAllocator *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_unique_ptr<FixedSizeBuffer>_>_&&>::value,_pair<iterator,_bool>_>
  _Var2;
  unsigned_long *buffer_id;
  iterator __end1_1;
  iterator __begin1_1;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *__range1_1;
  pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>
  *buffer;
  iterator __end1;
  iterator __begin1;
  unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>_>
  *__range1;
  idx_t upper_bound_id;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *in_stack_ffffffffffffff28;
  unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>_>
  *in_stack_ffffffffffffff30;
  pair<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>
  *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  _Node_iterator_base<unsigned_long,_false> local_88;
  _Node_iterator_base<unsigned_long,_false> local_80;
  long local_78;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
  local_70;
  undefined1 local_68;
  long local_50;
  pair<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>
  local_48;
  reference local_38;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
  local_28;
  long local_20;
  idx_t local_18;
  long local_10;
  
  local_10 = in_RSI;
  local_18 = GetUpperBoundBufferId(in_RDI);
  local_20 = local_10 + 0x38;
  local_28._M_cur =
       (__node_type *)
       ::std::
       unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>_>
       ::begin((unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>_>
                *)in_stack_ffffffffffffff28);
  local_30._M_cur =
       (__node_type *)
       ::std::
       unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>_>
       ::end((unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>_>
              *)in_stack_ffffffffffffff28);
  while( true ) {
    bVar1 = ::std::__detail::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    local_38 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false,_false>
               ::operator*((_Node_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false,_false>
                            *)0x77cb4a);
    in_stack_ffffffffffffff30 = &in_RDI->buffers;
    local_50 = local_38->first + local_18;
    in_stack_ffffffffffffff38 = &local_48;
    ::std::
    make_pair<unsigned_long,duckdb::unique_ptr<duckdb::FixedSizeBuffer,std::default_delete<duckdb::FixedSizeBuffer>,true>>
              (&in_stack_ffffffffffffff38->first,
               (unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                *)in_stack_ffffffffffffff30);
    _Var2 = ::std::
            unordered_map<unsigned_long,duckdb::unique_ptr<duckdb::FixedSizeBuffer,std::default_delete<duckdb::FixedSizeBuffer>,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::FixedSizeBuffer,std::default_delete<duckdb::FixedSizeBuffer>,true>>>>
            ::
            insert<std::pair<unsigned_long,duckdb::unique_ptr<duckdb::FixedSizeBuffer,std::default_delete<duckdb::FixedSizeBuffer>,true>>>
                      ((unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38);
    local_70._M_cur =
         (__node_type *)
         _Var2.first.
         super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
         ._M_cur;
    in_stack_ffffffffffffff47 = _Var2.second;
    local_68 = in_stack_ffffffffffffff47;
    ::std::
    pair<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>
    ::~pair((pair<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>
             *)0x77cbe0);
    ::std::__detail::
    _Node_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false,_false>
    ::operator++((_Node_iterator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false,_false>
                  *)in_stack_ffffffffffffff30);
  }
  ::std::
  unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>_>
  ::clear((unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>_>
           *)0x77cc26);
  local_78 = local_10 + 0x70;
  local_80._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
       ::begin(in_stack_ffffffffffffff28);
  local_88._M_cur =
       (__node_type *)
       ::std::
       unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
       ::end(in_stack_ffffffffffffff28);
  while( true ) {
    bVar1 = ::std::__detail::operator!=(&local_80,&local_88);
    if (!bVar1) break;
    ::std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator*
              ((_Node_iterator<unsigned_long,_true,_false> *)0x77cc74);
    ::std::
    unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
    ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             &in_stack_ffffffffffffff38->first);
    ::std::__detail::_Node_iterator<unsigned_long,_true,_false>::operator++
              ((_Node_iterator<unsigned_long,_true,_false> *)in_stack_ffffffffffffff30);
  }
  ::std::
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  ::clear((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
           *)0x77ccc7);
  NextBufferWithFreeSpace
            ((FixedSizeAllocator *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  in_RDI->total_segment_count = *(long *)(local_10 + 0x30) + in_RDI->total_segment_count;
  return;
}

Assistant:

void FixedSizeAllocator::Merge(FixedSizeAllocator &other) {
	D_ASSERT(segment_size == other.segment_size);

	// remember the buffer count and merge the buffers
	idx_t upper_bound_id = GetUpperBoundBufferId();
	for (auto &buffer : other.buffers) {
		buffers.insert(make_pair(buffer.first + upper_bound_id, std::move(buffer.second)));
	}
	other.buffers.clear();

	// merge the buffers with free spaces
	for (auto &buffer_id : other.buffers_with_free_space) {
		buffers_with_free_space.insert(buffer_id + upper_bound_id);
	}
	other.buffers_with_free_space.clear();
	NextBufferWithFreeSpace();

	// add the total allocations
	total_segment_count += other.total_segment_count;
}